

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixcomm.c
# Opt level: O0

void WriteLispStringToPipe(LispPTR lispstr)

{
  LispPTR *pLVar1;
  ulong uVar2;
  DLword *pDVar3;
  size_t sVar4;
  LispPTR local_5c;
  ulong local_58;
  size_t lf_ii;
  size_t lf_i;
  char *lf_dptr;
  char *lf_sptr;
  size_t lf_length;
  short *lf_sbase;
  char *lf_dp;
  char *lf_base;
  OneDArray *lf_arrayp;
  unsigned_short len;
  LispPTR lispstr_local;
  
  lf_arrayp._4_4_ = lispstr;
  pLVar1 = NativeAligned4FromLAddr(lispstr);
  if ((int)pLVar1[2] < 0x800) {
    local_5c = pLVar1[2];
  }
  else {
    local_5c = 0x800;
  }
  uVar2 = (ulong)(int)local_5c;
  if (*(char *)((long)pLVar1 + 6) == 'C') {
    pDVar3 = NativeAligned2FromLAddr(*pLVar1 & 0xfffffff);
    lf_i = (size_t)shcom;
    lf_dptr = (char *)((long)pDVar3 + (long)(int)(uint)(ushort)pLVar1[1]);
    for (lf_ii = 0; lf_ii < uVar2; lf_ii = lf_ii + 1) {
      *(undefined1 *)lf_i = *(undefined1 *)((ulong)lf_dptr ^ 3);
      lf_i = lf_i + 1;
      lf_dptr = lf_dptr + 1;
    }
    shcom[uVar2] = '\0';
  }
  else if (*(char *)((long)pLVar1 + 6) == 'D') {
    pDVar3 = NativeAligned2FromLAddr(*pLVar1 & 0xfffffff);
    lf_length = (size_t)(pDVar3 + (int)(uint)(ushort)pLVar1[1]);
    lf_sbase = (short *)shcom;
    for (local_58 = 0; local_58 < uVar2; local_58 = local_58 + 1) {
      *(char *)lf_sbase = (char)*(undefined2 *)(lf_length ^ 2);
      lf_length = lf_length + 2;
      lf_sbase = (short *)((long)lf_sbase + 1);
    }
    *(undefined1 *)lf_sbase = 0;
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  sVar4 = strlen(shcom);
  lf_arrayp._2_2_ = (short)sVar4 + 1;
  write(UnixPipeOut,(void *)((long)&lf_arrayp + 2),2);
  write(UnixPipeOut,shcom,(ulong)lf_arrayp._2_2_);
  return;
}

Assistant:

void WriteLispStringToPipe(LispPTR lispstr) {
  unsigned short len;
  LispStringToCString(lispstr, shcom, 2048);
  /* Write string length, then string */
  len = strlen(shcom) + 1;
  write(UnixPipeOut, &len, 2);
  write(UnixPipeOut, shcom, len);
}